

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocset(voccxdef *ctx,vocdef *v,prpnum p,objnum objn,int classflg,uchar *wrdtxt,int len,
           uchar *wrd2,int len2)

{
  uint uVar1;
  
  uVar1 = vochsh(wrdtxt,len);
  v->vocnxt = ctx->voccxhsh[uVar1];
  ctx->voccxhsh[uVar1] = v;
  v->voclen = (uchar)len;
  v->vocln2 = (uchar)len2;
  voccpy(v->voctxt,wrdtxt,len);
  if (wrd2 != (uchar *)0x0) {
    voccpy(v->voctxt + len,wrd2,len2);
  }
  vocwset(ctx,v,p,objn,classflg);
  return;
}

Assistant:

static void vocset(voccxdef *ctx, vocdef *v, prpnum p, objnum objn,
                   int classflg, uchar *wrdtxt, int len,
                   uchar *wrd2, int len2)
{
    uint hshval = vochsh(wrdtxt, len);
    
    v->vocnxt = ctx->voccxhsh[hshval];
    ctx->voccxhsh[hshval] = v;
    
    v->voclen = len;
    v->vocln2 = len2;
    voccpy(v->voctxt, wrdtxt, len);
    if (wrd2) voccpy(v->voctxt + len, wrd2, len2);

    /* allocate and initialize a vocwdef for the object */
    vocwset(ctx, v, p, objn, classflg);
}